

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# have_sys_socket.c
# Opt level: O0

int sys_socket_sendto_udp_target(network_target *target,char *msg,size_t msg_size)

{
  ssize_t sVar1;
  int *piVar2;
  ssize_t send_result;
  size_t msg_size_local;
  char *msg_local;
  network_target *target_local;
  
  lock_network_target(target);
  sVar1 = send(target->handle,msg,msg_size,0x4000);
  if (sVar1 == -1) {
    unlock_network_target(target);
    piVar2 = __errno_location();
    raise_socket_send_failure
              ("send failed with a sys/socket.h socket",*piVar2,"errno after the failed call");
    target_local._4_4_ = -1;
  }
  else {
    unlock_network_target(target);
    target_local._4_4_ = 1;
  }
  return target_local._4_4_;
}

Assistant:

int
sys_socket_sendto_udp_target( const struct network_target *target,
                              const char *msg,
                              size_t msg_size ) {
  ssize_t send_result;

  lock_network_target( target );
  send_result = send( target->handle,
                      msg,
                      msg_size,
                      config_disallow_signal_during_sending_flag );

  if( unlikely( send_result == -1 ) ){
    unlock_network_target( target );
    raise_socket_send_failure( L10N_SEND_SYS_SOCKET_FAILED_ERROR_MESSAGE,
                               errno,
                               L10N_ERRNO_ERROR_CODE_TYPE );
    return -1;
  }

  unlock_network_target( target );

  return 1;
}